

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_randomspawner.cpp
# Opt level: O2

void __thiscall ARandomSpawner::BeginPlay(ARandomSpawner *this)

{
  ActorFlags4 *pAVar1;
  BYTE *pBVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  DDropItem *di;
  PClassActor *this_00;
  PClassActor *pPVar6;
  int iVar7;
  int iVar8;
  DDropItem *di_00;
  ulong uVar9;
  FName local_50;
  FName local_4c;
  DVector3 local_48;
  
  bVar3 = (level.flags2 & 0x8000) == 0;
  bVar4 = (dmflags.Value & 0x1000U) == 0;
  AActor::BeginPlay(&this->super_AActor);
  di = AActor::GetDropItems(&this->super_AActor);
  if (di != (DDropItem *)0x0) {
    iVar7 = 0;
    di_00 = di;
    while (di_00 != (DDropItem *)0x0) {
      if ((di_00->Name).Index != 0) {
        if ((bVar3 && bVar4) || (bVar5 = IsMonster(di_00), !bVar5)) {
          iVar8 = di_00->Amount;
          if (iVar8 < 0) {
            di_00->Amount = 1;
            iVar8 = 1;
          }
          iVar7 = iVar7 + iVar8;
        }
        di_00 = di_00->Next;
      }
    }
    if (iVar7 == 0) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
      return;
    }
    iVar7 = FRandom::operator()(&pr_randomspawn,iVar7);
    while ((-1 < iVar7 && (di != (DDropItem *)0x0))) {
      if (((di->Name).Index == 0) || ((!bVar3 || !bVar4 && (bVar5 = IsMonster(di), bVar5)))) {
        di = di->Next;
      }
      else {
        iVar8 = iVar7 - di->Amount;
        iVar7 = -1;
        if (di->Next != (DDropItem *)0x0 && -1 < iVar8) {
          di = di->Next;
          iVar7 = iVar8;
        }
      }
    }
    if ((di == (DDropItem *)0x0) || (0x1f < (this->super_AActor).bouncecount)) {
      FName::FName(&local_4c,"Unknown");
      local_48.X = (this->super_AActor).__Pos.X;
      local_48.Y = (this->super_AActor).__Pos.Y;
      local_48.Z = (this->super_AActor).__Pos.Z;
      Spawn(&local_4c,&local_48,NO_REPLACE);
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
    }
    else {
      iVar7 = FRandom::operator()(&pr_randomspawn);
      if (iVar7 <= di->Probability) {
        local_50.Index = (di->Name).Index;
        this_00 = PClass::FindActor(&local_50);
        if (this_00 == (PClassActor *)0x0) {
          Printf("\x1cGUnknown item class %s to drop from a random spawner\n",
                 FName::NameData.NameArray[(di->Name).Index].Text);
          (this->super_AActor).Species.super_FName.Index = 0;
        }
        else {
          pPVar6 = PClassActor::GetReplacement(this_00,true);
          if (pPVar6 == (PClassActor *)0x0) {
            pPVar6 = this_00;
          }
          (this->super_AActor).Species.super_FName.Index =
               (pPVar6->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
               Index;
          pBVar2 = (pPVar6->super_PClass).Defaults;
          (this->super_AActor).Speed = *(double *)(pBVar2 + 0xe0);
          uVar9._0_4_ = (this->super_AActor).flags;
          uVar9._4_4_ = (this->super_AActor).flags2;
          uVar9 = uVar9 | *(ulong *)(pBVar2 + 0x1bc) & 0x4000000000010000;
          (this->super_AActor).flags = (ActorFlags)(int)uVar9;
          (this->super_AActor).flags2 = (ActorFlags2)(int)(uVar9 >> 0x20);
          pAVar1 = &(this->super_AActor).flags4;
          pAVar1->Value = pAVar1->Value | *(uint *)(pBVar2 + 0x1c8) & 0x40000;
        }
      }
    }
  }
  return;
}

Assistant:

void BeginPlay()
	{
		DDropItem *di;   // di will be our drop item list iterator
		DDropItem *drop; // while drop stays as the reference point.
		int n = 0;
		bool nomonsters = (dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS);

		Super::BeginPlay();
		drop = di = GetDropItems();
		if (di != NULL)
		{
			while (di != NULL)
			{
				if (di->Name != NAME_None)
				{
					if (!nomonsters || !IsMonster(di))
					{
						if (di->Amount < 0) di->Amount = 1; // default value is -1, we need a positive value.
						n += di->Amount; // this is how we can weight the list.
					}
					di = di->Next;
				}
			}
			if (n == 0)
			{ // Nothing left to spawn. They must have all been monsters, and monsters are disabled.
				Destroy();
				return;
			}
			// Then we reset the iterator to the start position...
			di = drop;
			// Take a random number...
			n = pr_randomspawn(n);
			// And iterate in the array up to the random number chosen.
			while (n > -1 && di != NULL)
			{
				if (di->Name != NAME_None &&
					(!nomonsters || !IsMonster(di)))
				{
					n -= di->Amount;
					if ((di->Next != NULL) && (n > -1))
						di = di->Next;
					else
						n = -1;
				}
				else
				{
					di = di->Next;
				}
			}
			// So now we can spawn the dropped item.
			if (di == NULL || bouncecount >= MAX_RANDOMSPAWNERS_RECURSION)	// Prevents infinite recursions
			{
				Spawn("Unknown", Pos(), NO_REPLACE);		// Show that there's a problem.
				Destroy();
				return;
			}
			else if (pr_randomspawn() <= di->Probability)	// prob 255 = always spawn, prob 0 = almost never spawn.
			{
				// Handle replacement here so as to get the proper speed and flags for missiles
				PClassActor *cls;
				cls = PClass::FindActor(di->Name);
				if (cls != NULL)
				{
					PClassActor *rep = cls->GetReplacement();
					if (rep != NULL)
					{
						cls = rep;
					}
				}
				if (cls != NULL)
				{
					Species = cls->TypeName;
					AActor *defmobj = GetDefaultByType(cls);
					this->Speed = defmobj->Speed;
					this->flags  |= (defmobj->flags  & MF_MISSILE);
					this->flags2 |= (defmobj->flags2 & MF2_SEEKERMISSILE);
					this->flags4 |= (defmobj->flags4 & MF4_SPECTRAL);
				}
				else
				{
					Printf(TEXTCOLOR_RED "Unknown item class %s to drop from a random spawner\n", di->Name.GetChars());
					Species = NAME_None;
				}
			}
		}
	}